

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

int __thiscall tetgenmesh::removefacebyflips(tetgenmesh *this,triface *flipface,flipconstraints *fc)

{
  tetrahedron pa;
  tetrahedron pb;
  tetrahedron pb_00;
  tetrahedron pc;
  double *pd;
  int iVar1;
  long lVar2;
  int *piVar3;
  double dVar4;
  triface local_78;
  triface local_68;
  ulong local_58;
  int local_50;
  
  lVar2 = 8;
  do {
    *(undefined8 *)((long)&local_78.ver + lVar2) = 0;
    *(undefined4 *)((long)&local_68.tet + lVar2) = 0;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x38);
  local_68.tet = flipface->tet;
  local_68.ver = flipface->ver;
  local_50 = fsymtbl[local_68.ver][(uint)local_68.tet[local_68.ver & 3] & 0xf];
  local_58 = (ulong)local_68.tet[local_68.ver & 3] & 0xfffffffffffffff0;
  pa = local_68.tet[orgpivot[local_68.ver]];
  pb = local_68.tet[destpivot[local_68.ver]];
  pb_00 = local_68.tet[apexpivot[local_68.ver]];
  pc = local_68.tet[oppopivot[local_68.ver]];
  pd = *(double **)(local_58 + (long)oppopivot[local_50] * 8);
  dVar4 = orient3d((double *)pa,(double *)pb,(double *)pc,pd);
  if (dVar4 <= 0.0) {
    local_78.tet = flipface->tet;
    piVar3 = &flipface->ver;
  }
  else {
    dVar4 = orient3d((double *)pb,(double *)pb_00,(double *)pc,pd);
    if (dVar4 <= 0.0) {
      local_78.tet = flipface->tet;
      iVar1 = flipface->ver;
      piVar3 = enexttbl;
    }
    else {
      dVar4 = orient3d((double *)pb_00,(double *)pa,(double *)pc,pd);
      if (0.0 < dVar4) {
        flip23(this,&local_68,0,fc);
        return 1;
      }
      local_78.tet = flipface->tet;
      iVar1 = flipface->ver;
      piVar3 = eprevtbl;
    }
    piVar3 = piVar3 + iVar1;
  }
  local_78.ver = *piVar3;
  iVar1 = removeedgebyflips(this,&local_78,fc);
  return (uint)(iVar1 == 2);
}

Assistant:

int tetgenmesh::removefacebyflips(triface *flipface, flipconstraints* fc)
{
  triface fliptets[3], flipedge;
  point pa, pb, pc, pd, pe;
  REAL ori;
  int reducflag = 0;

  fliptets[0] = *flipface;
  fsym(*flipface, fliptets[1]);
  pa = org(fliptets[0]);
  pb = dest(fliptets[0]);
  pc = apex(fliptets[0]);
  pd = oppo(fliptets[0]);
  pe = oppo(fliptets[1]);

  ori = orient3d(pa, pb, pd, pe);
  if (ori > 0) {
    ori = orient3d(pb, pc, pd, pe);
    if (ori > 0) {
      ori = orient3d(pc, pa, pd, pe);
      if (ori > 0) {
        // Found a 2-to-3 flip.
        reducflag = 1;
      } else {
        eprev(*flipface, flipedge); // [c,a]
      }
    } else {
      enext(*flipface, flipedge); // [b,c]
    }
  } else {
    flipedge = *flipface; // [a,b]
  }

  if (reducflag) {
    // A 2-to-3 flip is found.
    flip23(fliptets, 0, fc);
    return 1;
  } else {
    // Try to flip the selected edge of this face.
    if (removeedgebyflips(&flipedge, fc) == 2) {
      return 1;
    }
  }

  // Face is not removed.
  return 0;
}